

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::ValidationErrorCollector::AddError
          (ValidationErrorCollector *this,string *filename,string *element_name,Message *descriptor,
          ErrorLocation location,string *message)

{
  MultiFileErrorCollector *pMVar1;
  uint local_40;
  uint local_3c;
  int column;
  int line;
  string *message_local;
  Message *pMStack_28;
  ErrorLocation location_local;
  Message *descriptor_local;
  string *element_name_local;
  string *filename_local;
  ValidationErrorCollector *this_local;
  
  if (this->owner_->error_collector_ != (MultiFileErrorCollector *)0x0) {
    _column = message;
    message_local._4_4_ = location;
    pMStack_28 = descriptor;
    descriptor_local = (Message *)element_name;
    element_name_local = filename;
    filename_local = (string *)this;
    if (location == IMPORT) {
      SourceLocationTable::FindImport
                (&this->owner_->source_locations_,descriptor,element_name,(int *)&local_3c,
                 (int *)&local_40);
    }
    else {
      SourceLocationTable::Find
                (&this->owner_->source_locations_,descriptor,location,(int *)&local_3c,
                 (int *)&local_40);
    }
    pMVar1 = this->owner_->error_collector_;
    (*pMVar1->_vptr_MultiFileErrorCollector[2])
              (pMVar1,element_name_local,(ulong)local_3c,(ulong)local_40,_column);
  }
  return;
}

Assistant:

void SourceTreeDescriptorDatabase::ValidationErrorCollector::AddError(
    const std::string& filename, const std::string& element_name,
    const Message* descriptor, ErrorLocation location,
    const std::string& message) {
  if (owner_->error_collector_ == NULL) return;

  int line, column;
  if (location == DescriptorPool::ErrorCollector::IMPORT) {
    owner_->source_locations_.FindImport(descriptor, element_name, &line,
                                         &column);
  } else {
    owner_->source_locations_.Find(descriptor, location, &line, &column);
  }
  owner_->error_collector_->AddError(filename, line, column, message);
}